

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_test.c
# Opt level: O1

int main(void)

{
  long lVar1;
  
  lVar1 = mpp_osal_calloc("main",400);
  if (lVar1 == 0) {
    _mpp_log_l(4,"mpp_mem_test","calloc  failed\n",0);
    lVar1 = 0;
  }
  else {
    _mpp_log_l(4,"mpp_mem_test","calloc  success ptr 0x%p\n",0,lVar1);
    lVar1 = mpp_osal_realloc("main",lVar1,800);
    if (lVar1 == 0) {
      lVar1 = 0;
      _mpp_log_l(4,"mpp_mem_test","realloc failed\n",0);
    }
    else {
      _mpp_log_l(4,"mpp_mem_test","realloc success ptr 0x%p\n",0,lVar1);
    }
  }
  mpp_osal_free("main",lVar1);
  _mpp_log_l(4,"mpp_mem_test","mpp_mem_test done\n",0);
  return 0;
}

Assistant:

int main()
{
    void *tmp = NULL;

    tmp = mpp_calloc(int, 100);
    if (tmp) {
        mpp_log("calloc  success ptr 0x%p\n", tmp);
    } else {
        mpp_log("calloc  failed\n");
    }
    if (tmp) {
        tmp = mpp_realloc(tmp, int, 200);
        if (tmp) {
            mpp_log("realloc success ptr 0x%p\n", tmp);
        } else {
            mpp_log("realloc failed\n");
        }
    }
    mpp_free(tmp);
    mpp_log("mpp_mem_test done\n");

    return 0;
}